

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhash.h
# Opt level: O3

mh_assoc_t * mh_assoc_new(void)

{
  size_t size;
  mh_assoc_t *h;
  mh_assoc_t *pmVar1;
  assoc_val **ppaVar2;
  mh_int_t *__s;
  
  h = (mh_assoc_t *)tnt_mem_alloc(0x38);
  if (h != (mh_assoc_t *)0x0) {
    h->prime = 0;
    h->resize_cnt = 0;
    h->resize_position = 0;
    h->batch = 0;
    h->n_buckets = 0;
    h->n_dirty = 0;
    h->size = 0;
    h->upper_bound = 0;
    h->p = (assoc_val **)0x0;
    h->b = (mh_int_t *)0x0;
    h->shadow = (mh_assoc_t *)0x0;
    pmVar1 = (mh_assoc_t *)tnt_mem_alloc(0x38);
    if (pmVar1 == (mh_assoc_t *)0x0) {
      pmVar1 = (mh_assoc_t *)&h->shadow;
    }
    else {
      pmVar1->prime = 0;
      pmVar1->resize_cnt = 0;
      pmVar1->resize_position = 0;
      pmVar1->batch = 0;
      pmVar1->n_buckets = 0;
      pmVar1->n_dirty = 0;
      pmVar1->size = 0;
      pmVar1->upper_bound = 0;
      pmVar1->p = (assoc_val **)0x0;
      pmVar1->b = (mh_int_t *)0x0;
      pmVar1->shadow = (mh_assoc_t *)0x0;
      h->shadow = pmVar1;
      h->prime = 0;
      h->n_buckets = 3;
      ppaVar2 = (assoc_val **)tnt_mem_alloc(0x18);
      pmVar1 = h;
      if (ppaVar2 != (assoc_val **)0x0) {
        *ppaVar2 = (assoc_val *)0x0;
        ppaVar2[1] = (assoc_val *)0x0;
        ppaVar2[2] = (assoc_val *)0x0;
        h->p = ppaVar2;
        size = (ulong)(h->n_buckets >> 4) * 4 + 4;
        __s = (mh_int_t *)tnt_mem_alloc(size);
        if (__s != (mh_int_t *)0x0) {
          memset(__s,0,size);
          h->b = __s;
          h->upper_bound = (mh_int_t)(long)((double)h->n_buckets * 0.7);
          return h;
        }
        pmVar1 = (mh_assoc_t *)&h->b;
      }
    }
    pmVar1->p = (assoc_val **)0x0;
    mh_assoc_delete(h);
  }
  return (mh_assoc_t *)0x0;
}

Assistant:

struct _mh(t) *
_mh(new)()
{
	struct _mh(t) *h = (struct _mh(t) *) MH_CALLOC(1, sizeof(*h));
	if (!h) return NULL;
	memset(h, 0, sizeof(struct _mh(t)));
	h->shadow = (struct _mh(t) *) MH_CALLOC(1, sizeof(*h));
	if (!h->shadow) goto error;
	h->prime = 0;
	h->n_buckets = __ac_prime_list[h->prime];
	h->p = (mh_node_t *) MH_CALLOC(h->n_buckets, sizeof(mh_node_t));
	if (!h->p) goto error;
	h->b = (mh_int_t *) MH_CALLOC(h->n_buckets / 16 + 1, sizeof(mh_int_t));
	if (!h->b) goto error;
	h->upper_bound = h->n_buckets * MH_DENSITY;
	return h;
error:
	_mh(delete)(h);
	return NULL;
}